

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O0

Value<char> * __thiscall Qentem::Value<char>::GetValue(Value<char> *this,char *key,SizeT length)

{
  uint uVar1;
  ValueType VVar2;
  bool bVar3;
  SizeT SVar4;
  Value<char> *pVVar5;
  Value<char> *val_1;
  Value<char> *pVStack_30;
  SizeT index;
  Value<char> *val;
  char *pcStack_20;
  SizeT length_local;
  char *key_local;
  Value<char> *this_local;
  
  val._4_4_ = length;
  pcStack_20 = key;
  key_local = (char *)this;
  VVar2 = Type(this);
  if (VVar2 == ValuePtr) {
    this_local = GetValue((this->field_0).array_.storage_,pcStack_20,val._4_4_);
  }
  else if (VVar2 == Object) {
    pVStack_30 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::GetValue
                           ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)this,pcStack_20,
                            val._4_4_);
    if ((pVStack_30 == (Value<char> *)0x0) || (bVar3 = isUndefined(pVStack_30), bVar3)) {
      this_local = (Value<char> *)0x0;
    }
    else {
      this_local = pVStack_30;
    }
  }
  else if (VVar2 == Array) {
    Digit::FastStringToNumber<unsigned_int,char>((uint *)((long)&val_1 + 4),pcStack_20,val._4_4_);
    uVar1 = val_1._4_4_;
    SVar4 = Array<Qentem::Value<char>_>::Size((Array<Qentem::Value<char>_> *)this);
    if (uVar1 < SVar4) {
      pVVar5 = Array<Qentem::Value<char>_>::Storage((Array<Qentem::Value<char>_> *)this);
      bVar3 = isUndefined(pVVar5 + val_1._4_4_);
      if (!bVar3) {
        return pVVar5 + val_1._4_4_;
      }
    }
    this_local = (Value<char> *)0x0;
  }
  else {
    this_local = (Value<char> *)0x0;
  }
  return this_local;
}

Assistant:

Value *GetValue(const Char_T *key, SizeT length) const noexcept {
        switch (Type()) {
            case ValueType::Object: {
                Value *val = object_.GetValue(key, length);

                if ((val != nullptr) && !(val->isUndefined())) {
                    return val;
                }

                return nullptr;
            }

            case ValueType::Array: {
                SizeT index;
                Digit::FastStringToNumber(index, key, length);

                if (index < array_.Size()) {
                    Value *val = (array_.Storage() + index);

                    if (!(val->isUndefined())) {
                        return val;
                    }
                }

                return nullptr;
            }

            case ValueType::ValuePtr: {
                return value_->GetValue(key, length);
            }

            default:
                return nullptr;
        }
    }